

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_psnr_enc.c
# Opt level: O3

double AccumulateLSIM(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int w,int h)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint8_t *puVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  if (h < 1) {
    dVar10 = 0.0;
  }
  else {
    dVar10 = 0.0;
    uVar3 = 0;
    do {
      uVar4 = 2;
      if (2 < (int)uVar3) {
        uVar4 = uVar3 & 0xffffffff;
      }
      if (0 < w) {
        iVar5 = (int)uVar3 + 3;
        if (h <= iVar5) {
          iVar5 = h;
        }
        uVar1 = 0;
        do {
          uVar2 = 2;
          if (2 < (int)uVar1) {
            uVar2 = uVar1 & 0xffffffff;
          }
          dVar11 = 65025.0;
          if ((int)uVar4 + -2 < iVar5) {
            iVar7 = (int)uVar1 + 3;
            if (w <= iVar7) {
              iVar7 = w;
            }
            dVar11 = 65025.0;
            lVar8 = uVar4 - 2;
            puVar9 = src + (long)src_stride * (uVar4 - 2);
            do {
              lVar6 = uVar2 - 2;
              dVar12 = dVar11;
              if ((int)uVar2 + -2 < iVar7) {
                do {
                  dVar11 = ((double)puVar9[lVar6] - (double)ref[uVar1 + uVar3 * (long)ref_stride]) *
                           ((double)puVar9[lVar6] - (double)ref[uVar1 + uVar3 * (long)ref_stride]);
                  if (dVar12 <= dVar11) {
                    dVar11 = dVar12;
                  }
                  lVar6 = lVar6 + 1;
                  dVar12 = dVar11;
                } while (lVar6 < iVar7);
              }
              lVar8 = lVar8 + 1;
              puVar9 = puVar9 + src_stride;
            } while (lVar8 < iVar5);
          }
          dVar10 = dVar10 + dVar11;
          uVar1 = uVar1 + 1;
        } while (uVar1 != (uint)w);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)h);
  }
  return dVar10;
}

Assistant:

static double AccumulateLSIM(const uint8_t* src, int src_stride,
                             const uint8_t* ref, int ref_stride,
                             int w, int h) {
  int x, y;
  double total_sse = 0.;
  for (y = 0; y < h; ++y) {
    const int y_0 = (y - RADIUS < 0) ? 0 : y - RADIUS;
    const int y_1 = (y + RADIUS + 1 >= h) ? h : y + RADIUS + 1;
    for (x = 0; x < w; ++x) {
      const int x_0 = (x - RADIUS < 0) ? 0 : x - RADIUS;
      const int x_1 = (x + RADIUS + 1 >= w) ? w : x + RADIUS + 1;
      double best_sse = 255. * 255.;
      const double value = (double)ref[y * ref_stride + x];
      int i, j;
      for (j = y_0; j < y_1; ++j) {
        const uint8_t* const s = src + j * src_stride;
        for (i = x_0; i < x_1; ++i) {
          const double diff = s[i] - value;
          const double sse = diff * diff;
          if (sse < best_sse) best_sse = sse;
        }
      }
      total_sse += best_sse;
    }
  }
  return total_sse;
}